

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmCommonTargetGenerator::AppendFortranFormatFlags
          (cmCommonTargetGenerator *this,string *flags,cmSourceFile *source)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmGeneratorTarget *this_00;
  cmMakefile *this_01;
  cmLocalCommonGenerator *pcVar3;
  FortranFormat FVar4;
  string *psVar5;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *pcVar6;
  string_view value;
  string_view value_00;
  string srcfmt;
  allocator<char> local_69;
  string local_68;
  long *local_48;
  cmOutputConverter *local_40;
  long local_38 [2];
  
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Fortran_FORMAT","");
  psVar5 = cmSourceFile::GetSafeProperty(source,&local_68);
  pcVar2 = (psVar5->_M_dataplus)._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + psVar5->_M_string_length);
  pcVar6 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    pcVar6 = extraout_RDX_00;
  }
  value._M_str = pcVar6;
  value._M_len = (size_t)local_48;
  FVar4 = cmOutputConverter::GetFortranFormat(local_40,value);
  if (FVar4 == FortranFormatNone) {
    this_00 = this->GeneratorTarget;
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Fortran_FORMAT","");
    psVar5 = cmGeneratorTarget::GetSafeProperty(this_00,&local_68);
    pcVar6 = extraout_RDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      pcVar6 = extraout_RDX_02;
    }
    value_00._M_str = pcVar6;
    value_00._M_len = (size_t)(psVar5->_M_dataplus)._M_p;
    FVar4 = cmOutputConverter::GetFortranFormat
                      ((cmOutputConverter *)psVar5->_M_string_length,value_00);
  }
  if (FVar4 == FortranFormatFixed) {
    pcVar6 = "CMAKE_Fortran_FORMAT_FIXED_FLAG";
  }
  else {
    if (FVar4 != FortranFormatFree) goto LAB_0035c0e4;
    pcVar6 = "CMAKE_Fortran_FORMAT_FREE_FLAG";
  }
  this_01 = this->Makefile;
  pcVar3 = this->LocalCommonGenerator;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,pcVar6,&local_69);
  psVar5 = cmMakefile::GetSafeDefinition(this_01,&local_68);
  (*(pcVar3->super_cmLocalGenerator).super_cmOutputConverter._vptr_cmOutputConverter[7])
            (pcVar3,flags,psVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
LAB_0035c0e4:
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return;
}

Assistant:

void cmCommonTargetGenerator::AppendFortranFormatFlags(
  std::string& flags, cmSourceFile const& source)
{
  const std::string srcfmt = source.GetSafeProperty("Fortran_FORMAT");
  cmOutputConverter::FortranFormat format =
    cmOutputConverter::GetFortranFormat(srcfmt);
  if (format == cmOutputConverter::FortranFormatNone) {
    std::string const& tgtfmt =
      this->GeneratorTarget->GetSafeProperty("Fortran_FORMAT");
    format = cmOutputConverter::GetFortranFormat(tgtfmt);
  }
  const char* var = nullptr;
  switch (format) {
    case cmOutputConverter::FortranFormatFixed:
      var = "CMAKE_Fortran_FORMAT_FIXED_FLAG";
      break;
    case cmOutputConverter::FortranFormatFree:
      var = "CMAKE_Fortran_FORMAT_FREE_FLAG";
      break;
    default:
      break;
  }
  if (var) {
    this->LocalCommonGenerator->AppendFlags(
      flags, this->Makefile->GetSafeDefinition(var));
  }
}